

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_line_reporter.h
# Opt level: O0

void __thiscall
bandit::detail::single_line_reporter::~single_line_reporter(single_line_reporter *this)

{
  single_line_reporter *this_local;
  
  ~single_line_reporter(this);
  operator_delete(this);
  return;
}

Assistant:

single_line_reporter(std::ostream& stm, const failure_formatter& failure_formatter,
        const detail::colorizer& colorizer)
      : progress_reporter(failure_formatter), stm_(stm), colorizer_(colorizer)
    {}